

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LogStream.cc
# Opt level: O0

LogStream * __thiscall tt::LogStream::operator<<(LogStream *this,longdouble v)

{
  int iVar1;
  char *__s;
  int len;
  longdouble v_local;
  LogStream *this_local;
  
  iVar1 = detail::FixedBuffer<4000>::avail(&this->m_buffer);
  if (0x1f < iVar1) {
    __s = detail::FixedBuffer<4000>::current(&this->m_buffer);
    iVar1 = snprintf(__s,0x20,"%.12Lg");
    detail::FixedBuffer<4000>::add(&this->m_buffer,(long)iVar1);
  }
  return this;
}

Assistant:

LogStream& LogStream::operator<< (long double v){
	if(m_buffer.avail() >= kMaxNumbericSize){
		int len = snprintf(m_buffer.current(),kMaxNumbericSize,"%.12Lg",v);

		m_buffer.add(len);
	}


	return *this;
}